

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  unsigned_short *ldata_00;
  ValidityMask *rdata_00;
  SelectionVector *in_RCX;
  unsigned_short *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffee8;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffef0;
  undefined1 fun_00;
  SelectionVector *lsel;
  ValidityMask *in_stack_ffffffffffffff30;
  SelectionVector *in_stack_ffffffffffffff38;
  SelectionVector *rvalidity;
  ValidityMask *in_stack_ffffffffffffff40;
  UnifiedVectorFormat *in_stack_ffffffffffffff80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88._M_pi,
             in_stack_ffffffffffffff80);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88._M_pi,
             in_stack_ffffffffffffff80);
  fun_00 = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  Vector::SetVectorType(in_stack_fffffffffffffef0,vector_type_p);
  ldata_00 = FlatVector::GetData<unsigned_short>((Vector *)0x134069d);
  UnifiedVectorFormat::GetData<unsigned_short>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
  UnifiedVectorFormat::GetData<unsigned_short>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  lsel = (SelectionVector *)&stack0xffffffffffffff90;
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff48;
  rvalidity = in_stack_ffffffffffffff38;
  rdata_00 = FlatVector::Validity((Vector *)0x134071e);
  ExecuteGenericLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool>
            (ldata_00,(unsigned_short *)rdata_00,(unsigned_short *)this,lsel,in_RCX,
             (idx_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(ValidityMask *)rvalidity,
             in_stack_ffffffffffffff40,(bool)fun_00);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}